

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  TransformerLogLog *this_00;
  bool bVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  ImPlotPoint IVar7;
  ImVec2 P2;
  ImVec2 local_48;
  ImRect local_40;
  
  this_00 = this->Transformer;
  IVar7 = GetterXsYs<short>::operator()(this->Getter,prim + 1);
  local_40.Max = (ImVec2)IVar7.y;
  local_40.Min = (ImVec2)IVar7.x;
  IVar4 = TransformerLogLog::operator()(this_00,(ImPlotPoint *)&local_40);
  fVar5 = IVar4.x;
  fVar6 = IVar4.y;
  fVar1 = (this->P1).x;
  fVar2 = (this->P1).y;
  local_40.Min.x = fVar1;
  if (fVar5 <= fVar1) {
    local_40.Min.x = fVar5;
  }
  local_40.Min.y = fVar2;
  if (fVar6 <= fVar2) {
    local_40.Min.y = fVar6;
  }
  local_40.Max.y =
       (float)(-(uint)(fVar6 <= fVar2) & (uint)fVar2 | ~-(uint)(fVar6 <= fVar2) & (uint)fVar6);
  local_40.Max.x =
       (float)(-(uint)(fVar5 <= fVar1) & (uint)fVar1 | ~-(uint)(fVar5 <= fVar1) & (uint)fVar5);
  local_48 = IVar4;
  bVar3 = ImRect::Overlaps(cull_rect,&local_40);
  if (bVar3) {
    AddLine(&this->P1,&local_48,this->Weight,this->Col,DrawList,*uv);
    IVar4 = local_48;
  }
  this->P1 = IVar4;
  return bVar3;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }